

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Utf8ComputeByteLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  long lVar2;
  uint uVar3;
  uint *data;
  long lVar4;
  bool bVar5;
  
  data = (uint *)chunks->data;
  do {
    bVar5 = length == 0;
    length = length - 1;
    if (bVar5) {
      return 0;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UTF16) {
      uVar3 = Col_Utf16Get((Col_Char2 *)data);
LAB_0010924b:
      lVar4 = 1;
      if (((0x7f < uVar3) && (lVar4 = 2, 0x7ff < uVar3)) && (lVar4 = 3, 0xd7ff < uVar3)) {
        if (uVar3 < 0xe000) goto LAB_00109270;
        if (0xffff < uVar3) {
          lVar4 = (ulong)(uVar3 < 0x110000) << 2;
        }
      }
    }
    else {
      if (CVar1 == COL_UCS2) {
        uVar3 = (uint)(ushort)*data;
        goto LAB_0010924b;
      }
      if (CVar1 == COL_UCS4) {
        uVar3 = *data;
        goto LAB_0010924b;
      }
      if (CVar1 == COL_UTF8) {
        uVar3 = Col_Utf8Get((Col_Char1 *)data);
        goto LAB_0010924b;
      }
      if (CVar1 == COL_UCS1) {
        uVar3 = (uint)(byte)*data;
        goto LAB_0010924b;
      }
LAB_00109270:
      lVar4 = 0;
    }
    lVar2 = *clientData;
    *(long *)clientData = lVar4 + lVar2;
    if (0xfda < (ulong)(lVar4 + lVar2)) {
      return 1;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UCS1) {
      data = (uint *)((long)data + 1);
    }
    else if (CVar1 == COL_UCS2) {
      data = (uint *)((long)data + 2);
    }
    else if (CVar1 == COL_UCS4) {
      data = data + 1;
    }
    else if (CVar1 == COL_UTF8) {
      data = (uint *)Col_Utf8Next((Col_Char1 *)data);
    }
    else if (CVar1 == COL_UTF16) {
      data = (uint *)Col_Utf16Next((Col_Char2 *)data);
    }
    else {
      data = (uint *)0x0;
    }
  } while( true );
}

Assistant:

static int
Utf8ComputeByteLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *byteLengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        *byteLengthPtr += COL_UTF8_WIDTH(c) * CHAR_WIDTH(COL_UTF8);

        /*!
         * @retval 1 stops traversal if byte length exceeds
         * #UTFSTR_MAX_BYTELENGTH.
         */

        if (*byteLengthPtr > UTFSTR_MAX_BYTELENGTH) return 1;
    }

    /*!
     * @retval 0 will continue traversal.
     */

    return 0;
}